

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O1

void __thiscall
Gluco::vec<Gluco::vec<unsigned_int>_>::clear(vec<Gluco::vec<unsigned_int>_> *this,bool dealloc)

{
  vec<unsigned_int> *pvVar1;
  void *__ptr;
  long lVar2;
  long lVar3;
  
  if (this->data != (vec<unsigned_int> *)0x0) {
    if (0 < this->sz) {
      lVar3 = 0;
      lVar2 = 0;
      do {
        pvVar1 = this->data;
        __ptr = *(void **)((long)&pvVar1->data + lVar3);
        if (__ptr != (void *)0x0) {
          *(undefined4 *)((long)&pvVar1->sz + lVar3) = 0;
          free(__ptr);
          *(undefined8 *)((long)&pvVar1->data + lVar3) = 0;
          *(undefined4 *)((long)&pvVar1->cap + lVar3) = 0;
        }
        lVar2 = lVar2 + 1;
        lVar3 = lVar3 + 0x10;
      } while (lVar2 < this->sz);
    }
    this->sz = 0;
    if (dealloc) {
      free(this->data);
      this->data = (vec<unsigned_int> *)0x0;
      this->cap = 0;
    }
  }
  return;
}

Assistant:

void vec<T>::clear(bool dealloc) {
    if (data != NULL){
        for (int i = 0; i < sz; i++) data[i].~T();
        sz = 0;
        if (dealloc) free(data), data = NULL, cap = 0; } }